

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtiming.cpp
# Opt level: O3

void print_event_count_proc(Am_Object *interp)

{
  int iVar1;
  Am_Value *value;
  long lVar2;
  ostream *poVar3;
  Am_Time stop;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  Am_Object::Get_Prototype();
  value = (Am_Value *)Am_Object::Get((ushort)&AStack_38,0xca);
  Am_Object_Method::Am_Object_Method(&local_28,value);
  Am_Object::Am_Object(&local_30,interp);
  (*local_28.Call)((Am_Object_Data *)&local_30);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&AStack_38);
  iVar1 = (int)event_count;
  Am_Time::Now();
  Am_Time::operator-((Am_Time *)&AStack_38,(Am_Time *)&local_28);
  lVar2 = Am_Time::Milliseconds();
  Am_Time::~Am_Time((Am_Time *)&AStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Animation constraint executed ",0x1e);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," steps in ",10);
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for average cost of ",0x14);
  poVar3 = std::ostream::_M_insert<double>((double)lVar2 / (double)iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ms per iteration.",0x12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ostream::flush();
  Am_Exit_Main_Event_Loop();
  Am_Time::~Am_Time((Am_Time *)&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, print_event_count, (Am_Object interp))
{
  Am_Object_Method(interp.Get_Prototype().Get(Am_DO_METHOD)).Call(interp);

  int n = event_count;
  Am_Time stop = Am_Time::Now();

  long ms = (stop - start).Milliseconds();

  std::cout << "Animation constraint executed " << n << " steps in " << ms
            << std::endl
            << "for average cost of " << double(ms) / n << " ms per iteration."
            << std::endl
            << std::flush;

  Am_Exit_Main_Event_Loop();
}